

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O2

int AF_AWeapon_A_ZoomFactor
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  uint uVar1;
  DObject *this;
  _func_int **pp_Var2;
  bool bVar3;
  char *pcVar4;
  DObject *this_00;
  double dVar5;
  double dVar6;
  
  if (numparam < 1) {
LAB_004a48d3:
    pcVar4 = "(paramnum) < numparam";
  }
  else {
    if ((param->field_0).field_3.Type == '\x03') {
      this_00 = (DObject *)(param->field_0).field_1.a;
      if ((param->field_0).field_1.atag == 1) {
        if (this_00 == (DObject *)0x0) {
LAB_004a478d:
          this_00 = (DObject *)0x0;
        }
        else {
          bVar3 = DObject::IsKindOf(this_00,AActor::RegistrationInfo.MyClass);
          if (!bVar3) {
            pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
            goto LAB_004a48e3;
          }
        }
        if (numparam == 1) goto LAB_004a48d3;
        if (param[1].field_0.field_3.Type == '\x03') {
          this = (DObject *)param[1].field_0.field_1.a;
          if (param[1].field_0.field_1.atag == 1) {
            if (this != (DObject *)0x0) {
              bVar3 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
              if (!bVar3) {
                pcVar4 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
                goto LAB_004a48e3;
              }
            }
          }
          else if (this != (DObject *)0x0) goto LAB_004a48ca;
          if (2 < (uint)numparam) {
            if (param[2].field_0.field_3.Type == '\x03') {
              if (numparam == 3) {
                param = defaultparam->Array;
                if (param[3].field_0.field_3.Type != '\x01') {
                  pcVar4 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_004a492a:
                  __assert_fail(pcVar4,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                                ,0x82a,
                                "int AF_AWeapon_A_ZoomFactor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
                dVar5 = param[3].field_0.f;
              }
              else {
                if (param[3].field_0.field_3.Type != '\x01') {
                  pcVar4 = "(param[paramnum]).Type == REGT_FLOAT";
                  goto LAB_004a492a;
                }
                dVar5 = param[3].field_0.f;
                if (4 < (uint)numparam) {
                  if (param[4].field_0.field_3.Type != '\0') {
                    pcVar4 = "(param[paramnum]).Type == REGT_INT";
                    goto LAB_004a4902;
                  }
                  goto LAB_004a4839;
                }
                param = defaultparam->Array;
              }
              if (param[4].field_0.field_3.Type != '\0') {
                pcVar4 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_004a4902:
                __assert_fail(pcVar4,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                              ,0x82b,
                              "int AF_AWeapon_A_ZoomFactor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                             );
              }
LAB_004a4839:
              pp_Var2 = this_00[0xe]._vptr_DObject;
              if ((pp_Var2 != (_func_int **)0x0) && (pp_Var2[0x1a] != (_func_int *)0x0)) {
                uVar1 = param[4].field_0.i;
                dVar6 = 50.0;
                if (dVar5 <= 50.0) {
                  dVar6 = dVar5;
                }
                dVar5 = (double)(-(ulong)(0.1 < dVar5) & (ulong)(1.0 / dVar6) |
                                ~-(ulong)(0.1 < dVar5) & 0x4024000000000000);
                if ((uVar1 & 1) != 0) {
                  *(float *)((long)pp_Var2 + 0x5c) =
                       (float)((double)*(float *)(pp_Var2 + 0xb) * dVar5);
                }
                if ((uVar1 & 2) != 0) {
                  dVar5 = -dVar5;
                }
                *(float *)(pp_Var2[0x1a] + 0x598) = (float)dVar5;
              }
              return 0;
            }
            pcVar4 = "param[paramnum].Type == REGT_POINTER";
            goto LAB_004a48e3;
          }
          goto LAB_004a48d3;
        }
      }
      else if (this_00 == (DObject *)0x0) goto LAB_004a478d;
    }
LAB_004a48ca:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_004a48e3:
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                ,0x829,
                "int AF_AWeapon_A_ZoomFactor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AWeapon, A_ZoomFactor)
{
	PARAM_ACTION_PROLOGUE(AActor);
	PARAM_FLOAT_DEF(zoom);
	PARAM_INT_DEF(flags);

	if (self->player != NULL && self->player->ReadyWeapon != NULL)
	{
		zoom = 1 / clamp(zoom, 0.1, 50.0);
		if (flags & 1)
		{ // Make the zoom instant.
			self->player->FOV = float(self->player->DesiredFOV * zoom);
		}
		if (flags & 2)
		{ // Disable pitch/yaw scaling.
			zoom = -zoom;
		}
		self->player->ReadyWeapon->FOVScale = float(zoom);
	}
	return 0;
}